

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

compute_mul_parity_result
fmt::v10::detail::dragonbox::cache_accessor<float>::compute_mul_parity
          (carrier_uint two_f,cache_entry_type *cache,int beta)

{
  uint64_t uVar1;
  uint64_t r;
  int beta_local;
  cache_entry_type *cache_local;
  carrier_uint two_f_local;
  
  if (beta < 1) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/oneapi-src[P]level-zero/third_party/spdlog_headers/spdlog/fmt/bundled/format-inl.h"
                ,0x13e,"");
  }
  if (beta < 0x40) {
    uVar1 = umul96_lower64(two_f,*cache);
    cache_local._6_2_ =
         (compute_mul_parity_result)
         CONCAT11((int)(uVar1 >> (0x20U - (char)beta & 0x3f)) == 0,
                  (uVar1 >> (0x40U - (char)beta & 0x3f) & 1) != 0);
    return cache_local._6_2_;
  }
  assert_fail("/workspace/llm4binary/github/license_c_cmakelists/oneapi-src[P]level-zero/third_party/spdlog_headers/spdlog/fmt/bundled/format-inl.h"
              ,0x13f,"");
}

Assistant:

static auto compute_mul_parity(carrier_uint two_f,
                                 const cache_entry_type& cache,
                                 int beta) noexcept
      -> compute_mul_parity_result {
    FMT_ASSERT(beta >= 1, "");
    FMT_ASSERT(beta < 64, "");

    auto r = umul96_lower64(two_f, cache);
    return {((r >> (64 - beta)) & 1) != 0,
            static_cast<uint32_t>(r >> (32 - beta)) == 0};
  }